

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O3

bool compare_defaults(t_const_value *newStructDefault,t_const_value *oldStructDefault)

{
  pointer pptVar1;
  pointer pptVar2;
  pointer pcVar3;
  undefined8 uVar4;
  t_const_value_type tVar5;
  t_const_value_type tVar6;
  int iVar7;
  int64_t iVar8;
  int64_t iVar9;
  pointer pptVar10;
  bool bVar11;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  newMap;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  oldMap;
  _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  local_90;
  _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  local_60;
  
  bVar11 = true;
  if (newStructDefault == (t_const_value *)0x0 && oldStructDefault == (t_const_value *)0x0) {
    return true;
  }
  if ((newStructDefault == (t_const_value *)0x0) != (oldStructDefault == (t_const_value *)0x0))
  goto switchD_001370bd_default;
  tVar5 = t_const_value::get_type(newStructDefault);
  tVar6 = t_const_value::get_type(oldStructDefault);
  if (tVar5 != tVar6) goto switchD_001370bd_default;
  tVar5 = t_const_value::get_type(newStructDefault);
  switch(tVar5) {
  case CV_INTEGER:
    iVar8 = t_const_value::get_integer(newStructDefault);
    iVar9 = t_const_value::get_integer(oldStructDefault);
    bVar11 = iVar8 == iVar9;
    break;
  case CV_DOUBLE:
    bVar11 = (bool)(-(oldStructDefault->doubleVal_ == newStructDefault->doubleVal_) & 1);
    break;
  case CV_STRING:
    local_90._M_impl._0_8_ = &local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar3 = (newStructDefault->stringVal_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (newStructDefault->stringVal_)._M_string_length);
    local_60._M_impl._0_8_ = &local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar3 = (oldStructDefault->stringVal_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar3,pcVar3 + (oldStructDefault->stringVal_)._M_string_length);
    goto LAB_00137223;
  case CV_MAP:
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree(&local_90,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)newStructDefault);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::_Rb_tree(&local_60,
               (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                *)oldStructDefault);
    if (local_60._M_impl.super__Rb_tree_header._M_node_count ==
        local_90._M_impl.super__Rb_tree_header._M_node_count) {
      bVar11 = std::
               equal<std::_Rb_tree_const_iterator<std::pair<t_const_value*const,t_const_value*>>,std::_Rb_tree_const_iterator<std::pair<t_const_value*const,t_const_value*>>,bool(*)(std::pair<t_const_value*,t_const_value*>,std::pair<t_const_value*,t_const_value*>)>
                         ((_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                           )local_90._M_impl.super__Rb_tree_header._M_header._M_left,
                          (_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                           )&local_90._M_impl.super__Rb_tree_header,
                          (_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                           )local_60._M_impl.super__Rb_tree_header._M_header._M_left,compare_pair);
    }
    else {
      bVar11 = false;
    }
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
    ::~_Rb_tree(&local_90);
    break;
  case CV_LIST:
    pptVar10 = (oldStructDefault->listVal_).
               super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    pptVar1 = (newStructDefault->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pptVar2 = (newStructDefault->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((long)(oldStructDefault->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pptVar10 == (long)pptVar2 - (long)pptVar1) {
      while( true ) {
        if (pptVar1 == pptVar2) {
          return bVar11;
        }
        bVar11 = compare_defaults(*pptVar1,*pptVar10);
        if (!bVar11) break;
        pptVar10 = pptVar10 + 1;
        pptVar1 = pptVar1 + 1;
      }
      return bVar11;
    }
  default:
switchD_001370bd_default:
    bVar11 = false;
    break;
  case CV_IDENTIFIER:
    local_90._M_impl._0_8_ = &local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar3 = (newStructDefault->identifierVal_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,
               pcVar3 + (newStructDefault->identifierVal_)._M_string_length);
    local_60._M_impl._0_8_ = &local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar3 = (oldStructDefault->identifierVal_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar3,
               pcVar3 + (oldStructDefault->identifierVal_)._M_string_length);
LAB_00137223:
    uVar4 = local_60._M_impl._0_8_;
    if (local_90._M_impl.super__Rb_tree_header._M_header._0_8_ ==
        local_60._M_impl.super__Rb_tree_header._M_header._0_8_) {
      if (local_90._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
        bVar11 = true;
      }
      else {
        iVar7 = bcmp((void *)local_90._M_impl._0_8_,(void *)local_60._M_impl._0_8_,
                     local_90._M_impl.super__Rb_tree_header._M_header._0_8_);
        bVar11 = iVar7 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if ((_Base_ptr *)uVar4 != &local_60._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)uVar4);
    }
    if ((_Base_ptr *)local_90._M_impl._0_8_ !=
        &local_90._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_90._M_impl._0_8_);
    }
  }
  return bVar11;
}

Assistant:

bool compare_defaults(t_const_value* newStructDefault, t_const_value* oldStructDefault)
{
   if(newStructDefault == nullptr && oldStructDefault == nullptr) return true;
   else if(newStructDefault == nullptr && oldStructDefault != nullptr) return false;
   else if (newStructDefault != nullptr && oldStructDefault == nullptr) return false;

   if(newStructDefault->get_type() != oldStructDefault->get_type())
   {
      return false;
   }

   switch(newStructDefault->get_type())
   {
      case t_const_value::CV_INTEGER:
         return (newStructDefault->get_integer() == oldStructDefault->get_integer());
      case t_const_value::CV_DOUBLE:
         return (newStructDefault->get_double() == oldStructDefault->get_double());
      case t_const_value::CV_STRING:
         return (newStructDefault->get_string() == oldStructDefault->get_string());
      case t_const_value::CV_LIST:
         {
            const std::vector<t_const_value*>& oldDefaultList = oldStructDefault->get_list();
            const std::vector<t_const_value*>& newDefaultList = newStructDefault->get_list();
            bool defaultValuesCompare = (oldDefaultList.size() == newDefaultList.size());

            return defaultValuesCompare && std::equal(newDefaultList.begin(), newDefaultList.end(), oldDefaultList.begin(), compare_defaults);
         }
      case t_const_value::CV_MAP:
         {
            const std::map<t_const_value*, t_const_value*, t_const_value::value_compare> newMap = newStructDefault->get_map();
            const std::map<t_const_value*, t_const_value*, t_const_value::value_compare> oldMap = oldStructDefault->get_map();

            bool defaultValuesCompare = (oldMap.size() == newMap.size());

            return defaultValuesCompare && std::equal(newMap.begin(), newMap.end(), oldMap.begin(), compare_pair);
         }
      case t_const_value::CV_IDENTIFIER:
         return (newStructDefault->get_identifier() == oldStructDefault->get_identifier());
      default:
         return false;
   }

}